

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLinLog>::
StairsRenderer(StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLinLog> *this
              ,GetterYs<unsigned_long_long> *getter,TransformerLinLog *transformer,ImU32 col,
              float weight)

{
  ImVec2 IVar1;
  ImPlotPoint local_20;
  
  this->Getter = getter;
  this->Transformer = transformer;
  this->Prims = getter->Count + -1;
  this->Col = col;
  this->HalfWeight = weight * 0.5;
  (this->P1).x = 0.0;
  (this->P1).y = 0.0;
  local_20 = GetterYs<unsigned_long_long>::operator()(getter,0);
  IVar1 = TransformerLinLog::operator()(transformer,&local_20);
  this->P1 = IVar1;
  return;
}

Assistant:

inline StairsRenderer(const TGetter& getter, const TTransformer& transformer, ImU32 col, float weight) :
        Getter(getter),
        Transformer(transformer),
        Prims(Getter.Count - 1),
        Col(col),
        HalfWeight(weight * 0.5f)
    {
        P1 = Transformer(Getter(0));
    }